

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

bool matchit::impl::
     matchPatternRangeImpl<0ul,0ul,1ul,2ul,__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>&,std::tuple<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&,matchit::impl::Context<>>
               (long *rangeBegin,Id<std::shared_ptr<const_mathiu::impl::Expr>_> *patternTuple,
               undefined4 depth,undefined8 context)

{
  bool bVar1;
  anon_class_16_2_afc162f5 func;
  undefined4 local_24;
  undefined4 *local_20;
  undefined8 local_18;
  
  local_20 = &local_24;
  local_24 = depth;
  local_18 = context;
  bVar1 = matchPatternRangeImpl<0ul,0ul,1ul,2ul,__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>&,std::tuple<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&,matchit::impl::Context<>>(__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>&,std::tuple<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&,int,matchit::impl::Context<>&,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)
          ::{lambda(auto:1&&,auto:2&&)#1}::operator()
                    (&local_20,(shared_ptr<const_mathiu::impl::Expr> *)*rangeBegin,patternTuple + 2)
  ;
  if ((bVar1) &&
     (bVar1 = matchPatternRangeImpl<0ul,0ul,1ul,2ul,__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>&,std::tuple<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&,matchit::impl::Context<>>(__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>&,std::tuple<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&,int,matchit::impl::Context<>&,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)
              ::{lambda(auto:1&&,auto:2&&)#1}::operator()
                        (&local_20,(shared_ptr<const_mathiu::impl::Expr> *)(*rangeBegin + 0x10),
                         patternTuple + 1), bVar1)) {
    bVar1 = matchPatternRangeImpl<0ul,0ul,1ul,2ul,__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>&,std::tuple<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&,matchit::impl::Context<>>(__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>&,std::tuple<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&,int,matchit::impl::Context<>&,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)
            ::{lambda(auto:1&&,auto:2&&)#1}::operator()
                      (&local_20,(shared_ptr<const_mathiu::impl::Expr> *)(*rangeBegin + 0x20),
                       patternTuple);
    return bVar1;
  }
  return false;
}

Assistant:

constexpr decltype(auto) matchPatternRangeImpl(RangeBegin &&rangeBegin,
                                                       PatternTuple &&patternTuple,
                                                       int32_t depth, ContextT &context,
                                                       std::index_sequence<I...>)
        {
            auto const func = [&](auto &&value, auto &&pattern)
            {
                return matchPattern(std::forward<decltype(value)>(value), pattern,
                                    depth + 1, context);
            };
            static_cast<void>(func);
            // Fix Me, avoid call next from begin every time.
            return (func(*std::next(rangeBegin, static_cast<long>(I)),
                         std::get<I + patternStartIdx>(patternTuple)) &&
                    ...);
        }